

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte bVar1;
  byte *__s;
  symbol *psVar2;
  ushort *puVar3;
  void *__ptr;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *__ptr_00;
  ulong uVar7;
  char *pcVar8;
  ushort **ppuVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  byte *pbVar19;
  
  uVar6 = lemp->nsymbol;
  sVar18 = (long)(int)uVar6 * 2;
  __ptr_00 = calloc(sVar18,8);
  uVar7 = 0;
  uVar17 = (uint)sVar18;
  uVar10 = 0;
  if (0 < (int)uVar17) {
    uVar10 = sVar18 & 0xffffffff;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined8 *)((long)__ptr_00 + uVar7 * 8) = 0;
  }
  __s = (byte *)lemp->vartype;
  uVar7 = 0;
  sVar18 = 0;
  if (__s != (byte *)0x0) {
    sVar18 = strlen((char *)__s);
  }
  uVar15 = 0;
  if (0 < (int)uVar6) {
    uVar15 = (ulong)uVar6;
  }
  for (; uVar6 = (uint)sVar18, uVar15 != uVar7; uVar7 = uVar7 + 1) {
    pcVar8 = lemp->symbols[uVar7]->datatype;
    if (pcVar8 != (char *)0x0) {
      sVar18 = strlen(pcVar8);
      uVar4 = (uint)sVar18;
      if ((int)(uint)sVar18 < (int)uVar6) {
        uVar4 = uVar6;
      }
      sVar18 = (size_t)uVar4;
    }
  }
  pcVar8 = (char *)malloc((long)(int)(uVar6 * 2 + 1));
  if ((__ptr_00 != (void *)0x0) && (pcVar8 != (char *)0x0)) {
    uVar7 = 0;
    do {
      if (uVar7 == uVar15) {
        pcVar13 = "Parse";
        if (lemp->name != (char *)0x0) {
          pcVar13 = lemp->name;
        }
        iVar5 = *plineno;
        if (mhflag != 0) {
          fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
          iVar5 = iVar5 + 1;
        }
        pcVar14 = "void*";
        if (lemp->tokentype != (char *)0x0) {
          pcVar14 = lemp->tokentype;
        }
        fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar13,pcVar14);
        if (mhflag == 0) {
          iVar5 = iVar5 + 1;
        }
        else {
          fwrite("#endif\n",7,1,(FILE *)out);
          iVar5 = iVar5 + 2;
        }
        fwrite("typedef union {\n",0x10,1,(FILE *)out);
        fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
        fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar13);
        iVar5 = iVar5 + 3;
        uVar7 = 0;
        while (uVar10 != uVar7) {
          __ptr = *(void **)((long)__ptr_00 + uVar7 * 8);
          uVar7 = uVar7 + 1;
          if (__ptr != (void *)0x0) {
            fprintf((FILE *)out,"  %s yy%d;\n",__ptr,uVar7 & 0xffffffff);
            iVar5 = iVar5 + 1;
            free(__ptr);
          }
        }
        if (lemp->errsym->useCnt != 0) {
          fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
          iVar5 = iVar5 + 1;
        }
        free(pcVar8);
        free(__ptr_00);
        fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
        *plineno = iVar5 + 1;
        return;
      }
      psVar2 = lemp->symbols[uVar7];
      if (psVar2 == lemp->errsym) {
        psVar2->dtnum = uVar17 | 1;
      }
      else if ((psVar2->type == NONTERMINAL) &&
              (pbVar19 = (byte *)psVar2->datatype, __s != (byte *)0x0 || pbVar19 != (byte *)0x0)) {
        if (pbVar19 == (byte *)0x0) {
          pbVar19 = __s;
        }
        ppuVar9 = __ctype_b_loc();
        puVar3 = *ppuVar9;
        pbVar11 = pbVar19 + -1;
        do {
          pbVar19 = pbVar19 + 1;
          uVar16 = (ulong)(char)pbVar11[1];
          pbVar11 = pbVar11 + 1;
        } while ((*(byte *)((long)puVar3 + uVar16 * 2 + 1) & 0x20) != 0);
        uVar12 = 0;
        while ((char)uVar16 != '\0') {
          pcVar8[uVar12] = (char)uVar16;
          uVar12 = uVar12 + 1;
          bVar1 = *pbVar19;
          pbVar19 = pbVar19 + 1;
          uVar16 = (ulong)bVar1;
        }
        for (; 0 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
          if ((*(byte *)((long)puVar3 + (long)pcVar8[(uVar12 & 0xffffffff) - 1] * 2 + 1) & 0x20) ==
              0) goto LAB_0010a2f6;
        }
        uVar12 = 0;
LAB_0010a2f6:
        pcVar8[uVar12 & 0xffffffff] = '\0';
        if ((lemp->tokentype == (char *)0x0) || (iVar5 = strcmp(pcVar8,lemp->tokentype), iVar5 != 0)
           ) {
          uVar6 = 0;
          for (pcVar13 = pcVar8; *pcVar13 != '\0'; pcVar13 = pcVar13 + 1) {
            uVar6 = uVar6 * 0x35 + (int)*pcVar13;
          }
          uVar16 = (long)((ulong)uVar6 & 0xffffffff7fffffff) % (long)(int)uVar17 & 0xffffffff;
          while( true ) {
            pcVar13 = *(char **)((long)__ptr_00 + uVar16 * 8);
            if (pcVar13 == (char *)0x0) break;
            iVar5 = strcmp(pcVar13,pcVar8);
            uVar6 = (int)uVar16 + 1;
            if (iVar5 == 0) {
              psVar2->dtnum = uVar6;
              goto LAB_0010a3b1;
            }
            if ((int)uVar17 <= (int)uVar6) {
              uVar6 = 0;
            }
            uVar16 = (ulong)uVar6;
          }
          psVar2->dtnum = (int)uVar16 + 1;
          sVar18 = strlen(pcVar8);
          pcVar13 = (char *)malloc((long)((int)sVar18 + 1));
          *(char **)((long)__ptr_00 + uVar16 * 8) = pcVar13;
          if (pcVar13 == (char *)0x0) break;
          strcpy(pcVar13,pcVar8);
        }
        else {
          psVar2->dtnum = 0;
        }
      }
      else {
        psVar2->dtnum = 0;
      }
LAB_0010a3b1:
      uVar7 = uVar7 + 1;
    } while( true );
  }
  fwrite("Out of memory.\n",0xf,1,_stderr);
  exit(1);
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = 0;           /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  int hash;                 /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( isspace(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && isspace(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}